

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

string * GetNetworkName_abi_cxx11_(Network net)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint in_ESI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *psVar1;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_ESI;
  psVar1 = in_RDI;
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_9);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_a);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_b);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_c);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_e);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_f);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x80,"std::string GetNetworkName(enum Network)");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x83,"std::string GetNetworkName(enum Network)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return psVar1;
}

Assistant:

std::string GetNetworkName(enum Network net)
{
    switch (net) {
    case NET_UNROUTABLE: return "not_publicly_routable";
    case NET_IPV4: return "ipv4";
    case NET_IPV6: return "ipv6";
    case NET_ONION: return "onion";
    case NET_I2P: return "i2p";
    case NET_CJDNS: return "cjdns";
    case NET_INTERNAL: return "internal";
    case NET_MAX: assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}